

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::detachClause(Solver *this,CRef cr,bool strict)

{
  CRef CVar1;
  bool bVar2;
  int iVar3;
  Lit p;
  vec<Gluco::Solver::Watcher> *pvVar4;
  Lit local_8c;
  int local_88;
  Lit local_84;
  int local_80;
  Watcher local_7c;
  int local_74;
  Lit local_70;
  int local_6c;
  Watcher local_68;
  int local_60;
  Lit local_5c;
  int local_58;
  Lit local_54;
  int local_50;
  Lit local_4c;
  int local_48;
  Watcher local_44;
  int local_3c;
  Lit local_38;
  int local_34;
  Watcher local_30;
  int local_28;
  Lit local_24;
  Clause *local_20;
  Clause *c;
  bool strict_local;
  Solver *pSStack_10;
  CRef cr_local;
  Solver *this_local;
  
  c._3_1_ = strict;
  c._4_4_ = cr;
  pSStack_10 = this;
  local_20 = ClauseAllocator::operator[](&this->ca,cr);
  iVar3 = Clause::size(local_20);
  if (iVar3 < 2) {
    __assert_fail("c.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                  ,0x135,"void Gluco::Solver::detachClause(CRef, bool)");
  }
  iVar3 = Clause::size(local_20);
  if (iVar3 == 2) {
    if ((c._3_1_ & 1) == 0) {
      local_50 = (int)Clause::operator[](local_20,0);
      local_4c = operator~((Lit)local_50);
      OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
      smudge(&this->watchesBin,&local_4c);
      local_58 = (int)Clause::operator[](local_20,1);
      local_54 = operator~((Lit)local_58);
      OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
      smudge(&this->watchesBin,&local_54);
    }
    else {
      local_28 = (int)Clause::operator[](local_20,0);
      local_24 = operator~((Lit)local_28);
      pvVar4 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
               ::operator[](&this->watchesBin,&local_24);
      CVar1 = c._4_4_;
      local_34 = (int)Clause::operator[](local_20,1);
      Watcher::Watcher(&local_30,CVar1,(Lit)local_34);
      remove<Gluco::vec<Gluco::Solver::Watcher>,Gluco::Solver::Watcher>(pvVar4,&local_30);
      local_3c = (int)Clause::operator[](local_20,1);
      local_38 = operator~((Lit)local_3c);
      pvVar4 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
               ::operator[](&this->watchesBin,&local_38);
      CVar1 = c._4_4_;
      local_48 = (int)Clause::operator[](local_20,0);
      Watcher::Watcher(&local_44,CVar1,(Lit)local_48);
      remove<Gluco::vec<Gluco::Solver::Watcher>,Gluco::Solver::Watcher>(pvVar4,&local_44);
    }
  }
  else if ((c._3_1_ & 1) == 0) {
    local_88 = (int)Clause::operator[](local_20,0);
    local_84 = operator~((Lit)local_88);
    OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::smudge
              (&this->watches,&local_84);
    p = Clause::operator[](local_20,1);
    local_8c = operator~(p);
    OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::smudge
              (&this->watches,&local_8c);
  }
  else {
    local_60 = (int)Clause::operator[](local_20,0);
    local_5c = operator~((Lit)local_60);
    pvVar4 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
             ::operator[](&this->watches,&local_5c);
    CVar1 = c._4_4_;
    local_6c = (int)Clause::operator[](local_20,1);
    Watcher::Watcher(&local_68,CVar1,(Lit)local_6c);
    remove<Gluco::vec<Gluco::Solver::Watcher>,Gluco::Solver::Watcher>(pvVar4,&local_68);
    local_74 = (int)Clause::operator[](local_20,1);
    local_70 = operator~((Lit)local_74);
    pvVar4 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
             ::operator[](&this->watches,&local_70);
    CVar1 = c._4_4_;
    local_80 = (int)Clause::operator[](local_20,0);
    Watcher::Watcher(&local_7c,CVar1,(Lit)local_80);
    remove<Gluco::vec<Gluco::Solver::Watcher>,Gluco::Solver::Watcher>(pvVar4,&local_7c);
  }
  bVar2 = Clause::learnt(local_20);
  if (bVar2) {
    iVar3 = Clause::size(local_20);
    this->learnts_literals = this->learnts_literals - (long)iVar3;
  }
  else {
    iVar3 = Clause::size(local_20);
    this->clauses_literals = this->clauses_literals - (long)iVar3;
  }
  return;
}

Assistant:

void Solver::detachClause(CRef cr, bool strict) {
    const Clause& c = ca[cr];
    
    assert(c.size() > 1);
    if(c.size()==2) {
      if (strict){
        remove(watchesBin[~c[0]], Watcher(cr, c[1]));
        remove(watchesBin[~c[1]], Watcher(cr, c[0]));
      }else{
        // Lazy detaching: (NOTE! Must clean all watcher lists before garbage collecting this clause)
        watchesBin.smudge(~c[0]);
        watchesBin.smudge(~c[1]);
      }
    } else {
      if (strict){
        remove(watches[~c[0]], Watcher(cr, c[1]));
        remove(watches[~c[1]], Watcher(cr, c[0]));
      }else{
        // Lazy detaching: (NOTE! Must clean all watcher lists before garbage collecting this clause)
        watches.smudge(~c[0]);
        watches.smudge(~c[1]);
      }
    }
    if (c.learnt()) learnts_literals -= c.size();
    else            clauses_literals -= c.size(); }